

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::GoniometricLight::I(GoniometricLight *this,Vector3f wl,SampledWavelengths *lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  Float FVar3;
  float fVar4;
  Point2f PVar5;
  float fVar8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar11 [56];
  SampledSpectrum SVar12;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar10 [64];
  
  auVar11 = wl._16_56_;
  PVar5 = EqualAreaSphereToSquare(wl);
  fVar1 = this->scale;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar1;
  auVar6._8_4_ = fVar1;
  auVar6._12_4_ = fVar1;
  auVar9 = ZEXT856(auVar6._8_8_);
  SVar12 = DenselySampledSpectrum::Sample(&this->Iemit,lambda);
  auVar10._0_8_ = SVar12.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = SVar12.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  auVar6 = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.x;
  auVar2._4_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.y;
  auVar2 = vmovshdup_avx(auVar2);
  FVar3 = Image::GetChannel(&this->image,
                            (Point2i)(CONCAT44((int)((ulong)lambda >> 0x20),
                                               (int)(PVar5.super_Tuple2<pbrt::Point2,_float>.x *
                                                    (float)(this->image).resolution.
                                                           super_Tuple2<pbrt::Point2,_int>.x)) |
                                     (ulong)(uint)(int)(auVar2._0_4_ *
                                                       (float)(this->image).resolution.
                                                              super_Tuple2<pbrt::Point2,_int>.y) <<
                                     0x20),0,(WrapMode2D)0x200000002);
  fVar4 = FVar3 * auVar6._0_4_ * fVar1;
  fVar8 = FVar3 * auVar6._4_4_ * fVar1;
  auVar6 = CONCAT412(FVar3 * auVar6._12_4_ * fVar1,
                     CONCAT48(FVar3 * auVar6._8_4_ * fVar1,CONCAT44(fVar8,fVar4)));
  auVar6 = vshufpd_avx(auVar6,auVar6,1);
  SVar12.values.values._8_8_ = auVar6._0_8_;
  SVar12.values.values[0] = fVar4;
  SVar12.values.values[1] = fVar8;
  return (SampledSpectrum)SVar12.values.values;
}

Assistant:

I(Vector3f wl, const SampledWavelengths &lambda) const {
        Point2f uv = EqualAreaSphereToSquare(wl);
        return scale * Iemit.Sample(lambda) * image.LookupNearestChannel(uv, 0);
    }